

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::LayoutBindingBaseCase::initDefaultCSContext_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  String *__return_storage_ptr___00;
  bool bVar4;
  int iVar5;
  mapped_type *ppcVar6;
  mapped_type *this_00;
  char *pcVar7;
  size_t sVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar9;
  undefined4 extraout_var_02;
  StringStream s;
  key_type local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
  *local_1c0;
  String *local_1b8;
  key_type local_1ac;
  undefined1 local_1a8 [112];
  undefined **local_138;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1c0 = &this->m_templates;
  local_1a8._0_4_ = ComputeShader;
  local_1b8 = __return_storage_ptr__;
  ppcVar6 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](local_1c0,(key_type *)local_1a8);
  *ppcVar6 = 
  "${VERSION}${UNIFORM_DECL}\n${OPTIONAL_FUNCTION_BLOCK}\nvoid main(void)\n{\n  ${OUT_VAR_TYPE} tmp = ${UNIFORM_ACCESS}\n  ${OUT_ASSIGNMENT} tmp ${OUT_END}\n}\n"
  ;
  local_1a8._0_4_ = 2;
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,(key_type *)local_1a8);
  std::ios_base::ios_base((ios_base *)&local_138);
  local_138 = (undefined **)glUniformMatrix3x2fv;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1a8._0_8_ = &PTR__StringStream_02138dd0;
  local_138 = &PTR__StringStream_02138df8;
  pcVar7 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)&local_208 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x60);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = 1) in;\nprecision highp float;\n",0x35);
  bVar4 = needsPrecision(this);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"precision highp ",0x10)
    ;
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    pcVar7 = *(char **)(CONCAT44(extraout_var,iVar5) + 0x18);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)&local_208 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x60);
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  }
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  if (*(int *)(CONCAT44(extraout_var_00,iVar5) + 8) == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(binding=0, std430) buffer outData {\n    ",0x2f);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    pcVar7 = *(char **)(CONCAT44(extraout_var_01,iVar5) + 0x10);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)&local_208 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x60);
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," outColor;\n};\n",0xe);
    paVar1 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OUT_ASSIGNMENT","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_208);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1b29821);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OUT_END","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_208);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1c02340);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "layout(binding=0, rgba8) uniform highp writeonly image2D outImage;\n",0x43);
    paVar1 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OUT_ASSIGNMENT","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_208);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1b2998d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OUT_END","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_208);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1c0233f);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"VERSION","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  pcVar7 = *(char **)(CONCAT44(extraout_var_02,iVar5) + 0x10);
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OUT_VAR_TYPE","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  pcVar3 = (char *)pmVar9->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar3,(ulong)pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"UNIFORM_ACCESS","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1b2980a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"UNIFORM_DECL","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1b32ab9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"OPTIONAL_FUNCTION_BLOCK","")
  ;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1b32ab9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1ac = ComputeShader;
  ppcVar6 = std::
            map<glcts::eStageType,_const_char_*,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_const_char_*>_>_>
            ::operator[](local_1c0,&local_1ac);
  __return_storage_ptr___00 = local_1b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,*ppcVar6,&local_1e1);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_208,&local_1e0);
  tcu::StringTemplate::specialize(__return_storage_ptr___00,(StringTemplate *)&local_208,this_00);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return __return_storage_ptr___00;
}

Assistant:

String initDefaultCSContext()
	{
		// build compute shader
		m_templates[ComputeShader] = "${VERSION}"
									 "${UNIFORM_DECL}\n"
									 "${OPTIONAL_FUNCTION_BLOCK}\n"
									 "void main(void)\n"
									 "{\n"
									 "  ${OUT_VAR_TYPE} tmp = ${UNIFORM_ACCESS}\n"
									 "  ${OUT_ASSIGNMENT} tmp ${OUT_END}\n"
									 "}\n";

		StringMap& args = m_templateParams[ComputeShader];
		// images don't have default precision qualifier
		StringStream s;
		s << glu::getGLSLVersionDeclaration(m_glslVersion) << "\n";
		s << "layout (local_size_x = 1) in;\n"
			 "precision highp float;\n";
		if (needsPrecision())
		{
			s << "precision highp " << getTestParameters().uniform_type << ";\n";
		}

		// bindings are per uniform type...
		if (getTestParameters().surface_type == Image)
		{
			s << "layout(binding=0, std430) buffer outData {\n"
				 "    "
			  << getTestParameters().vector_type << " outColor;\n"
													"};\n";
			args["OUT_ASSIGNMENT"] = "outColor =";
			args["OUT_END"]		   = ";";
		}
		else
		{
			s << "layout(binding=0, rgba8) uniform highp writeonly image2D outImage;\n";
			args["OUT_ASSIGNMENT"] = "imageStore(outImage, ivec2(0), ";
			args["OUT_END"]		   = ");";
		}
		args["VERSION"]					= s.str();
		args["OUT_VAR_TYPE"]			= getTestParameters().vector_type;
		args["UNIFORM_ACCESS"]			= "vec4(0.0,0.0,0.0,0.0);";
		args["UNIFORM_DECL"]			= "";
		args["OPTIONAL_FUNCTION_BLOCK"] = "";

		return tcu::StringTemplate(m_templates[ComputeShader]).specialize(args);
	}